

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  byte bVar1;
  Rep *pRVar2;
  void *pvVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  pEVar4 = FindOrNull(this,number);
  if (pEVar4 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x38b);
    pLVar5 = LogMessage::operator<<(&local_60,"CHECK failed: extension != nullptr: ");
    pLVar5 = LogMessage::operator<<(pLVar5,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_61,pLVar5);
    LogMessage::~LogMessage(&local_60);
  }
  if (pEVar4->is_repeated == false) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x38c);
    pLVar5 = LogMessage::operator<<(&local_60,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_61,pLVar5);
    LogMessage::~LogMessage(&local_60);
  }
  bVar1 = pEVar4->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x3f);
    pLVar5 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_61,pLVar5);
    LogMessage::~LogMessage(&local_60);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
  case 8:
    RepeatedField<int>::SwapElements((pEVar4->field_0).repeated_int32_t_value,index1,index2);
    break;
  case 2:
    RepeatedField<long>::SwapElements((pEVar4->field_0).repeated_int64_t_value,index1,index2);
    break;
  case 3:
    RepeatedField<unsigned_int>::SwapElements
              ((pEVar4->field_0).repeated_uint32_t_value,index1,index2);
    break;
  case 4:
    RepeatedField<unsigned_long>::SwapElements
              ((pEVar4->field_0).repeated_uint64_t_value,index1,index2);
    break;
  case 5:
    RepeatedField<double>::SwapElements((pEVar4->field_0).repeated_double_value,index1,index2);
    break;
  case 6:
    RepeatedField<float>::SwapElements((pEVar4->field_0).repeated_float_value,index1,index2);
    break;
  case 7:
    RepeatedField<bool>::SwapElements((pEVar4->field_0).repeated_bool_value,index1,index2);
    break;
  case 9:
  case 10:
    pRVar2 = (((pEVar4->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_;
    pvVar3 = pRVar2->elements[index1];
    pRVar2->elements[index1] = pRVar2->elements[index2];
    pRVar2->elements[index2] = pvVar3;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}